

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rmd256.c
# Opt level: O1

int rmd256_init(hash_state *md)

{
  if (md == (hash_state *)0x0) {
    rmd256_init_cold_1();
  }
  (md->rmd256).state[7] = 0x1234567;
  (md->sha3).s[8] = 0x6745230100000000;
  (md->sha3).s[9] = 0x98badcfeefcdab89;
  (md->sha3).s[10] = 0x7654321010325476;
  (md->sha3).s[0xb] = 0x89abcdeffedcba98;
  (md->chc).length = 0;
  return 0;
}

Assistant:

int rmd256_init(hash_state * md)
{
   LTC_ARGCHK(md != NULL);
   md->rmd256.state[0] = 0x67452301UL;
   md->rmd256.state[1] = 0xefcdab89UL;
   md->rmd256.state[2] = 0x98badcfeUL;
   md->rmd256.state[3] = 0x10325476UL;
   md->rmd256.state[4] = 0x76543210UL;
   md->rmd256.state[5] = 0xfedcba98UL;
   md->rmd256.state[6] = 0x89abcdefUL;
   md->rmd256.state[7] = 0x01234567UL;
   md->rmd256.curlen   = 0;
   md->rmd256.length   = 0;
   return CRYPT_OK;
}